

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O0

void safe_destroy(csafestring_t *obj)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void safe_destroy(csafestring_t *obj) {
	if ( obj == NULL ) {
		return;
	}

	if ( obj->data != NULL ) {
		free(obj->data);
	}

#ifdef EXPERIMENTAL_SIZING
	sizing_size -= obj->sizing_size;
	sizing_count--;
#endif
	
	free(obj);
}